

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::RemoveVariablesInString(cmMakefile *this,string *source,bool atOnly)

{
  bool bVar1;
  undefined7 in_register_00000011;
  RegularExpression var2;
  RegularExpression local_e0;
  
  if ((int)CONCAT71(in_register_00000011,atOnly) == 0) {
    local_e0.regmatch.startp[0] = (char *)0x0;
    local_e0.regmatch.endp[0] = (char *)0x0;
    local_e0.regmatch.searchstring = (char *)0x0;
    local_e0.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_e0,"(\\${[A-Za-z_0-9]*})");
    while( true ) {
      bVar1 = cmsys::RegularExpression::find
                        (&local_e0,(source->_M_dataplus)._M_p,&local_e0.regmatch);
      if (!bVar1) break;
      std::__cxx11::string::erase
                ((ulong)source,
                 (long)local_e0.regmatch.startp[0] - (long)local_e0.regmatch.searchstring);
    }
    if (local_e0.program != (char *)0x0) {
      operator_delete__(local_e0.program);
    }
    local_e0.regmatch.startp[0] = (char *)0x0;
    local_e0.regmatch.endp[0] = (char *)0x0;
    local_e0.regmatch.searchstring = (char *)0x0;
    local_e0.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_e0,"(\\$ENV{[A-Za-z_0-9]*})");
    while( true ) {
      bVar1 = cmsys::RegularExpression::find
                        (&local_e0,(source->_M_dataplus)._M_p,&local_e0.regmatch);
      if (!bVar1) break;
      std::__cxx11::string::erase
                ((ulong)source,
                 (long)local_e0.regmatch.startp[0] - (long)local_e0.regmatch.searchstring);
    }
    if (local_e0.program != (char *)0x0) {
      operator_delete__(local_e0.program);
    }
  }
  local_e0.regmatch.startp[0] = (char *)0x0;
  local_e0.regmatch.endp[0] = (char *)0x0;
  local_e0.regmatch.searchstring = (char *)0x0;
  local_e0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_e0,"(@[A-Za-z_0-9]*@)");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&local_e0,(source->_M_dataplus)._M_p,&local_e0.regmatch);
    if (!bVar1) break;
    std::__cxx11::string::erase
              ((ulong)source,
               (long)local_e0.regmatch.startp[0] - (long)local_e0.regmatch.searchstring);
  }
  if (local_e0.program != (char *)0x0) {
    operator_delete__(local_e0.program);
  }
  return;
}

Assistant:

void cmMakefile::RemoveVariablesInString(std::string& source,
                                         bool atOnly) const
{
  if (!atOnly) {
    cmsys::RegularExpression var("(\\${[A-Za-z_0-9]*})");
    while (var.find(source)) {
      source.erase(var.start(), var.end() - var.start());
    }
  }

  if (!atOnly) {
    cmsys::RegularExpression varb("(\\$ENV{[A-Za-z_0-9]*})");
    while (varb.find(source)) {
      source.erase(varb.start(), varb.end() - varb.start());
    }
  }
  cmsys::RegularExpression var2("(@[A-Za-z_0-9]*@)");
  while (var2.find(source)) {
    source.erase(var2.start(), var2.end() - var2.start());
  }
}